

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O1

void Eigen::internal::
     set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                *begin,__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                       *end,SparseMatrix<double,_0,_int> *mat,int Options)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Triplet<double,_int> *pTVar6;
  undefined4 uVar7;
  undefined8 *puVar8;
  Triplet<double,_int> *pTVar9;
  ulong uVar10;
  long lVar11;
  Index othersize;
  long lVar12;
  undefined1 local_78 [8];
  SparseMatrix<double,_1,_int> trMat;
  Matrix<int,__1,_1,_0,__1,_1> wi;
  
  local_78[0] = false;
  local_78._4_4_ = 0;
  trMat._0_4_ = 0;
  trMat.m_innerSize = 0;
  trMat._12_4_ = 0;
  trMat.m_outerIndex = (Index *)0x0;
  trMat.m_innerNonZeros = (Index *)0x0;
  trMat.m_data.m_values = (Scalar_conflict *)0x0;
  trMat.m_data.m_indices = (Index *)0x0;
  trMat.m_data.m_size = 0;
  SparseMatrix<double,_1,_int>::resize
            ((SparseMatrix<double,_1,_int> *)local_78,mat->m_innerSize,mat->m_outerSize);
  if (begin->_M_current != end->_M_current) {
    uVar7 = local_78._4_4_;
    lVar12 = (long)(int)local_78._4_4_;
    if (lVar12 == 0) {
      trMat.m_data.m_allocatedSize = 0;
    }
    else if (((int)local_78._4_4_ < 0) ||
            (trMat.m_data.m_allocatedSize = (size_t)malloc(lVar12 * 4),
            (void *)trMat.m_data.m_allocatedSize == (void *)0x0)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::streambuf::xsgetn;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    if ((int)uVar7 < 0) {
      __assert_fail("dim >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Matrix.h"
                    ,0xe1,
                    "Eigen::Matrix<int, -1, 1>::Matrix(Index) [_Scalar = int, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                   );
    }
    if (3 < (int)uVar7) {
      uVar10 = 0;
      do {
        puVar8 = (undefined8 *)(trMat.m_data.m_allocatedSize + uVar10 * 4);
        *puVar8 = 0;
        puVar8[1] = 0;
        uVar10 = uVar10 + 4;
      } while (uVar10 < (uVar7 & 0x7ffffffc));
    }
    if ((long)(ulong)(uVar7 & 0x7ffffffc) < lVar12) {
      memset((void *)((lVar12 << 2 & 0x1fffffff0U) + trMat.m_data.m_allocatedSize),0,
             lVar12 << 2 & 0x7ffffffe0000000c);
    }
    pTVar6 = end->_M_current;
    for (pTVar9 = begin->_M_current; pTVar6 != pTVar9; pTVar9 = pTVar9 + 1) {
      lVar11 = (long)pTVar9->m_row;
      if ((((lVar11 < 0) || (mat->m_innerSize <= pTVar9->m_row)) || (pTVar9->m_col < 0)) ||
         (mat->m_outerSize <= pTVar9->m_col)) {
        __assert_fail("it->row()>=0 && it->row()<mat.rows() && it->col()>=0 && it->col()<mat.cols()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                      ,0x3b8,
                      "void Eigen::internal::set_from_triplets(const InputIterator &, const InputIterator &, SparseMatrixType &, int) [InputIterator = __gnu_cxx::__normal_iterator<Eigen::Triplet<double> *, std::vector<Eigen::Triplet<double>>>, SparseMatrixType = Eigen::SparseMatrix<double>]"
                     );
      }
      if (lVar12 <= lVar11) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x18a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                     );
      }
      piVar1 = (int *)(trMat.m_data.m_allocatedSize + lVar11 * 4);
      *piVar1 = *piVar1 + 1;
    }
    SparseMatrix<double,1,int>::reserveInnerVectors<Eigen::Matrix<int,_1,1,0,_1,1>>
              ((SparseMatrix<double,1,int> *)local_78,
               (Matrix<int,__1,_1,_0,__1,_1> *)&trMat.m_data.m_allocatedSize);
    pTVar9 = begin->_M_current;
    pTVar6 = end->_M_current;
    if (pTVar6 != pTVar9) {
      if (trMat.m_outerIndex == (Index *)0x0) {
        __assert_fail("!isCompressed()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                      ,0x34a,
                      "Scalar &Eigen::SparseMatrix<double, 1>::insertBackUncompressed(Index, Index) [_Scalar = double, _Flags = 1, _Index = int]"
                     );
      }
      do {
        lVar12 = (long)pTVar9->m_row;
        iVar3 = trMat.m_outerIndex[lVar12];
        iVar4 = *(int *)(trMat._8_8_ + lVar12 * 4);
        if (*(int *)(trMat._8_8_ + 4 + lVar12 * 4) - iVar4 < iVar3) {
          __assert_fail("m_innerNonZeros[outer]<=(m_outerIndex[outer+1] - m_outerIndex[outer])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                        ,0x34b,
                        "Scalar &Eigen::SparseMatrix<double, 1>::insertBackUncompressed(Index, Index) [_Scalar = double, _Flags = 1, _Index = int]"
                       );
        }
        iVar5 = pTVar9->m_col;
        dVar2 = pTVar9->m_value;
        trMat.m_outerIndex[lVar12] = iVar3 + 1;
        lVar12 = (long)(iVar4 + iVar3);
        *(int *)((long)trMat.m_data.m_values + lVar12 * 4) = iVar5;
        *(double *)(trMat.m_innerNonZeros + lVar12 * 2) = dVar2;
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != pTVar6);
    }
    SparseMatrix<double,_1,_int>::sumupDuplicates((SparseMatrix<double,_1,_int> *)local_78);
    free((void *)trMat.m_data.m_allocatedSize);
  }
  SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)mat,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *)local_78);
  free((void *)trMat._8_8_);
  free(trMat.m_outerIndex);
  CompressedStorage<double,_int>::~CompressedStorage
            ((CompressedStorage<double,_int> *)&trMat.m_innerNonZeros);
  return;
}

Assistant:

void set_from_triplets(const InputIterator& begin, const InputIterator& end, SparseMatrixType& mat, int Options = 0)
{
  EIGEN_UNUSED_VARIABLE(Options);
  enum { IsRowMajor = SparseMatrixType::IsRowMajor };
  typedef typename SparseMatrixType::Scalar Scalar;
  typedef typename SparseMatrixType::Index Index;
  SparseMatrix<Scalar,IsRowMajor?ColMajor:RowMajor,Index> trMat(mat.rows(),mat.cols());

  if(begin!=end)
  {
    // pass 1: count the nnz per inner-vector
    Matrix<Index,Dynamic,1> wi(trMat.outerSize());
    wi.setZero();
    for(InputIterator it(begin); it!=end; ++it)
    {
      eigen_assert(it->row()>=0 && it->row()<mat.rows() && it->col()>=0 && it->col()<mat.cols());
      wi(IsRowMajor ? it->col() : it->row())++;
    }

    // pass 2: insert all the elements into trMat
    trMat.reserve(wi);
    for(InputIterator it(begin); it!=end; ++it)
      trMat.insertBackUncompressed(it->row(),it->col()) = it->value();

    // pass 3:
    trMat.sumupDuplicates();
  }

  // pass 4: transposed copy -> implicit sorting
  mat = trMat;
}